

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O0

int mod2sparse_equal(mod2sparse *m1,mod2sparse *m2)

{
  int *in_RSI;
  int *in_RDI;
  bool bVar1;
  int i;
  mod2entry *e2;
  mod2entry *e1;
  int local_2c;
  int *local_28;
  int *local_20;
  
  if ((*in_RDI == *in_RSI) && (in_RDI[1] == in_RSI[1])) {
    local_2c = 0;
    while( true ) {
      if (*in_RDI <= local_2c) {
        return 1;
      }
      local_20 = *(int **)(*(long *)(in_RDI + 2) + (long)local_2c * 0x38 + 0x10);
      local_28 = *(int **)(*(long *)(in_RSI + 2) + (long)local_2c * 0x38 + 0x10);
      while( true ) {
        bVar1 = false;
        if (-1 < *local_20) {
          bVar1 = -1 < *local_28;
        }
        if (!bVar1) break;
        if (local_20[1] != local_28[1]) {
          return 0;
        }
        local_20 = *(int **)(local_20 + 4);
        local_28 = *(int **)(local_28 + 4);
      }
      if ((-1 < *local_20) || (-1 < *local_28)) break;
      local_2c = local_2c + 1;
    }
    return 0;
  }
  fprintf(_stderr,"mod2sparse_equal: Matrices have different dimensions\n");
  exit(1);
}

Assistant:

int mod2sparse_equal
( mod2sparse *m1,
  mod2sparse *m2
)
{
  mod2entry *e1, *e2;
  int i;

  if (mod2sparse_rows(m1)!=mod2sparse_rows(m2) 
   || mod2sparse_cols(m1)!=mod2sparse_cols(m2))
  { fprintf(stderr,"mod2sparse_equal: Matrices have different dimensions\n");
    exit(1);
  }
  
  for (i = 0; i<mod2sparse_rows(m1); i++)
  { 
    e1 = mod2sparse_first_in_row(m1,i);
    e2 = mod2sparse_first_in_row(m2,i);

    while (!mod2sparse_at_end(e1) && !mod2sparse_at_end(e2))
    {  
      if (mod2sparse_col(e1)!=mod2sparse_col(e2))
      { return 0;
      }

      e1 = mod2sparse_next_in_row(e1);
      e2 = mod2sparse_next_in_row(e2);
    }

    if (!mod2sparse_at_end(e1) || !mod2sparse_at_end(e2)) 
    { return 0;
    }
  }

  return 1;
}